

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.h
# Opt level: O0

uchar bloaty::dwarf::ReadLEB128<unsigned_char>(string_view *data)

{
  byte bVar1;
  char *pcVar2;
  Int64Type val;
  char *pcVar3;
  char *str;
  
  pcVar2 = (char *)ReadLEB128Internal(data._7_1_,(string_view *)val);
  pcVar3 = pcVar2;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  str = pcVar3;
  if (pcVar2 <= (char *)(ulong)bVar1) {
    bVar1 = std::numeric_limits<unsigned_char>::min();
    if ((char *)(ulong)bVar1 <= pcVar3) {
      return (uchar)str;
    }
  }
  Throw(str,(int)((ulong)pcVar2 >> 0x20));
}

Assistant:

T ReadLEB128(std::string_view* data) {
  typedef typename std::conditional<std::is_signed<T>::value, int64_t,
                                    uint64_t>::type Int64Type;
  Int64Type val = ReadLEB128Internal(std::is_signed<T>::value, data);
  if (val > std::numeric_limits<T>::max() ||
      val < std::numeric_limits<T>::min()) {
    THROW("DWARF data contained larger LEB128 than we were expecting");
  }
  return static_cast<T>(val);
}